

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O0

void ncnn::convdw3x3s2_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  undefined8 *puVar36;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _r22_2;
  __m128 _r21_2;
  __m128 _r20_2;
  __m128 _r12_2;
  __m128 _r11_2;
  __m128 _r10_2;
  __m128 _r02_2;
  __m128 _r01_2;
  __m128 _r00_2;
  __m128 _sum0_2;
  __m128 _r24_1;
  __m128 _r14_1;
  __m128 _r04_1;
  __m128 _r23_1;
  __m128 _r13_1;
  __m128 _r03_1;
  __m128 _sum1_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  __m128 _r28;
  __m128 _r18;
  __m128 _r08;
  __m128 _r27;
  __m128 _r17;
  __m128 _r07;
  __m128 _sum3;
  __m128 _r26;
  __m128 _r16;
  __m128 _r06;
  __m128 _r25;
  __m128 _r15;
  __m128 _r05;
  __m128 _sum2;
  __m128 _r24;
  __m128 _r14;
  __m128 _r04;
  __m128 _r23;
  __m128 _r13;
  __m128 _r03;
  __m128 _sum1;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int tailstep;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  int local_2200;
  int local_21fc;
  undefined8 *local_2168;
  undefined8 *local_2160;
  undefined8 *local_2158;
  undefined8 *local_2108;
  int local_208c;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float local_1ba8;
  float fStack_1ba4;
  float fStack_1ba0;
  float fStack_1b9c;
  float local_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float local_1ac8;
  float fStack_1ac4;
  float fStack_1ac0;
  float fStack_1abc;
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  float local_1908;
  float fStack_1904;
  float fStack_1900;
  float fStack_18fc;
  float local_1898;
  float fStack_1894;
  float fStack_1890;
  float fStack_188c;
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float fStack_181c;
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float local_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float local_1668;
  float fStack_1664;
  float fStack_1660;
  float fStack_165c;
  float local_1588;
  float fStack_1584;
  float fStack_1580;
  float fStack_157c;
  float local_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar33 = in_RSI[6];
  lVar34 = in_RDI[7];
  iVar35 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 4;
  lVar2 = *in_RCX;
  for (local_208c = 0; local_208c < (int)lVar34; local_208c = local_208c + 1) {
    local_2108 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_208c * in_RSI[2]);
    if (lVar2 == 0) {
      local_25e8 = 0;
      uStack_25e0 = 0;
    }
    else {
      puVar36 = (undefined8 *)(lVar2 + (long)(local_208c << 2) * 4);
      local_25e8 = *puVar36;
      uStack_25e0 = puVar36[1];
    }
    puVar36 = (undefined8 *)
              (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_208c * in_RDX[2]);
    local_2158 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_208c * in_RDI[2]);
    local_2160 = (undefined8 *)((long)local_2158 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_2168 = (undefined8 *)
                 ((long)local_2158 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    uVar5 = *puVar36;
    uVar6 = puVar36[1];
    uVar7 = puVar36[2];
    uVar8 = puVar36[3];
    uVar9 = puVar36[4];
    uVar10 = puVar36[5];
    uVar11 = puVar36[6];
    uVar12 = puVar36[7];
    uVar13 = puVar36[8];
    uVar14 = puVar36[9];
    uVar15 = puVar36[10];
    uVar16 = puVar36[0xb];
    uVar17 = puVar36[0xc];
    uVar18 = puVar36[0xd];
    uVar19 = puVar36[0xe];
    uVar20 = puVar36[0xf];
    uVar3 = puVar36[0x10];
    uVar4 = puVar36[0x11];
    for (local_21fc = 0; local_21fc < (int)lVar33; local_21fc = local_21fc + 1) {
      local_2200 = 0;
      while( true ) {
        local_e8 = (float)uVar5;
        fStack_e4 = (float)((ulong)uVar5 >> 0x20);
        fStack_e0 = (float)uVar6;
        fStack_dc = (float)((ulong)uVar6 >> 0x20);
        local_118 = (float)local_25e8;
        fStack_114 = (float)((ulong)local_25e8 >> 0x20);
        fStack_110 = (float)uStack_25e0;
        fStack_10c = (float)((ulong)uStack_25e0 >> 0x20);
        local_158 = (float)uVar7;
        fStack_154 = (float)((ulong)uVar7 >> 0x20);
        fStack_150 = (float)uVar8;
        fStack_14c = (float)((ulong)uVar8 >> 0x20);
        local_1c8 = (float)uVar9;
        fStack_1c4 = (float)((ulong)uVar9 >> 0x20);
        fStack_1c0 = (float)uVar10;
        fStack_1bc = (float)((ulong)uVar10 >> 0x20);
        local_238 = (float)uVar11;
        fStack_234 = (float)((ulong)uVar11 >> 0x20);
        fStack_230 = (float)uVar12;
        fStack_22c = (float)((ulong)uVar12 >> 0x20);
        local_2a8 = (float)uVar13;
        fStack_2a4 = (float)((ulong)uVar13 >> 0x20);
        fStack_2a0 = (float)uVar14;
        fStack_29c = (float)((ulong)uVar14 >> 0x20);
        local_318 = (float)uVar15;
        fStack_314 = (float)((ulong)uVar15 >> 0x20);
        fStack_310 = (float)uVar16;
        fStack_30c = (float)((ulong)uVar16 >> 0x20);
        local_388 = (float)uVar17;
        fStack_384 = (float)((ulong)uVar17 >> 0x20);
        fStack_380 = (float)uVar18;
        fStack_37c = (float)((ulong)uVar18 >> 0x20);
        local_3f8 = (float)uVar19;
        fStack_3f4 = (float)((ulong)uVar19 >> 0x20);
        fStack_3f0 = (float)uVar20;
        fStack_3ec = (float)((ulong)uVar20 >> 0x20);
        local_468 = (float)uVar3;
        fStack_464 = (float)((ulong)uVar3 >> 0x20);
        fStack_460 = (float)uVar4;
        fStack_45c = (float)((ulong)uVar4 >> 0x20);
        if (iVar1 <= local_2200 + 3) break;
        local_f8 = (float)*local_2158;
        fStack_f4 = (float)((ulong)*local_2158 >> 0x20);
        fStack_f0 = (float)local_2158[1];
        fStack_ec = (float)((ulong)local_2158[1] >> 0x20);
        local_168 = (float)local_2158[2];
        fStack_164 = (float)((ulong)local_2158[2] >> 0x20);
        fStack_160 = (float)local_2158[3];
        fStack_15c = (float)((ulong)local_2158[3] >> 0x20);
        local_1d8 = (float)local_2158[4];
        fStack_1d4 = (float)((ulong)local_2158[4] >> 0x20);
        fStack_1d0 = (float)local_2158[5];
        fStack_1cc = (float)((ulong)local_2158[5] >> 0x20);
        local_248 = (float)*local_2160;
        fStack_244 = (float)((ulong)*local_2160 >> 0x20);
        fStack_240 = (float)local_2160[1];
        fStack_23c = (float)((ulong)local_2160[1] >> 0x20);
        local_2b8 = (float)local_2160[2];
        fStack_2b4 = (float)((ulong)local_2160[2] >> 0x20);
        fStack_2b0 = (float)local_2160[3];
        fStack_2ac = (float)((ulong)local_2160[3] >> 0x20);
        local_328 = (float)local_2160[4];
        fStack_324 = (float)((ulong)local_2160[4] >> 0x20);
        fStack_320 = (float)local_2160[5];
        fStack_31c = (float)((ulong)local_2160[5] >> 0x20);
        local_398 = (float)*local_2168;
        fStack_394 = (float)((ulong)*local_2168 >> 0x20);
        fStack_390 = (float)local_2168[1];
        fStack_38c = (float)((ulong)local_2168[1] >> 0x20);
        local_408 = (float)local_2168[2];
        fStack_404 = (float)((ulong)local_2168[2] >> 0x20);
        fStack_400 = (float)local_2168[3];
        fStack_3fc = (float)((ulong)local_2168[3] >> 0x20);
        local_478 = (float)local_2168[4];
        fStack_474 = (float)((ulong)local_2168[4] >> 0x20);
        fStack_470 = (float)local_2168[5];
        fStack_46c = (float)((ulong)local_2168[5] >> 0x20);
        uVar21 = local_2158[6];
        uVar22 = local_2158[7];
        uVar23 = local_2160[6];
        uVar24 = local_2160[7];
        uVar25 = local_2168[6];
        uVar26 = local_2168[7];
        uVar27 = local_2158[8];
        uVar28 = local_2158[9];
        uVar29 = local_2160[8];
        uVar30 = local_2160[9];
        uVar31 = local_2168[8];
        uVar32 = local_2168[9];
        *local_2108 = CONCAT44(fStack_464 * fStack_474 +
                               fStack_3f4 * fStack_404 +
                               fStack_384 * fStack_394 +
                               fStack_314 * fStack_324 +
                               fStack_2a4 * fStack_2b4 +
                               fStack_234 * fStack_244 +
                               fStack_1c4 * fStack_1d4 +
                               fStack_154 * fStack_164 + fStack_e4 * fStack_f4 + fStack_114,
                               local_468 * local_478 +
                               local_3f8 * local_408 +
                               local_388 * local_398 +
                               local_318 * local_328 +
                               local_2a8 * local_2b8 +
                               local_238 * local_248 +
                               local_1c8 * local_1d8 +
                               local_158 * local_168 + local_e8 * local_f8 + local_118);
        local_2108[1] =
             CONCAT44(fStack_45c * fStack_46c +
                      fStack_3ec * fStack_3fc +
                      fStack_37c * fStack_38c +
                      fStack_30c * fStack_31c +
                      fStack_29c * fStack_2ac +
                      fStack_22c * fStack_23c +
                      fStack_1bc * fStack_1cc +
                      fStack_14c * fStack_15c + fStack_dc * fStack_ec + fStack_10c,
                      fStack_460 * fStack_470 +
                      fStack_3f0 * fStack_400 +
                      fStack_380 * fStack_390 +
                      fStack_310 * fStack_320 +
                      fStack_2a0 * fStack_2b0 +
                      fStack_230 * fStack_240 +
                      fStack_1c0 * fStack_1d0 +
                      fStack_150 * fStack_160 + fStack_e0 * fStack_f0 + fStack_110);
        local_558 = (float)uVar21;
        fStack_554 = (float)((ulong)uVar21 >> 0x20);
        fStack_550 = (float)uVar22;
        fStack_54c = (float)((ulong)uVar22 >> 0x20);
        local_5c8 = (float)uVar27;
        fStack_5c4 = (float)((ulong)uVar27 >> 0x20);
        fStack_5c0 = (float)uVar28;
        fStack_5bc = (float)((ulong)uVar28 >> 0x20);
        local_6a8 = (float)uVar23;
        fStack_6a4 = (float)((ulong)uVar23 >> 0x20);
        fStack_6a0 = (float)uVar24;
        fStack_69c = (float)((ulong)uVar24 >> 0x20);
        local_718 = (float)uVar29;
        fStack_714 = (float)((ulong)uVar29 >> 0x20);
        fStack_710 = (float)uVar30;
        fStack_70c = (float)((ulong)uVar30 >> 0x20);
        local_7f8 = (float)uVar25;
        fStack_7f4 = (float)((ulong)uVar25 >> 0x20);
        fStack_7f0 = (float)uVar26;
        fStack_7ec = (float)((ulong)uVar26 >> 0x20);
        local_868 = (float)uVar31;
        fStack_864 = (float)((ulong)uVar31 >> 0x20);
        fStack_860 = (float)uVar32;
        fStack_85c = (float)((ulong)uVar32 >> 0x20);
        uVar21 = local_2158[10];
        uVar22 = local_2158[0xb];
        uVar23 = local_2160[10];
        uVar24 = local_2160[0xb];
        uVar25 = local_2168[10];
        uVar26 = local_2168[0xb];
        uVar27 = local_2158[0xc];
        uVar28 = local_2158[0xd];
        uVar29 = local_2160[0xc];
        uVar30 = local_2160[0xd];
        uVar31 = local_2168[0xc];
        uVar32 = local_2168[0xd];
        local_2108[2] =
             CONCAT44(fStack_464 * fStack_864 +
                      fStack_3f4 * fStack_7f4 +
                      fStack_384 * fStack_474 +
                      fStack_314 * fStack_714 +
                      fStack_2a4 * fStack_6a4 +
                      fStack_234 * fStack_324 +
                      fStack_1c4 * fStack_5c4 +
                      fStack_154 * fStack_554 + fStack_e4 * fStack_1d4 + fStack_114,
                      local_468 * local_868 +
                      local_3f8 * local_7f8 +
                      local_388 * local_478 +
                      local_318 * local_718 +
                      local_2a8 * local_6a8 +
                      local_238 * local_328 +
                      local_1c8 * local_5c8 +
                      local_158 * local_558 + local_e8 * local_1d8 + local_118);
        local_2108[3] =
             CONCAT44(fStack_45c * fStack_85c +
                      fStack_3ec * fStack_7ec +
                      fStack_37c * fStack_46c +
                      fStack_30c * fStack_70c +
                      fStack_29c * fStack_69c +
                      fStack_22c * fStack_31c +
                      fStack_1bc * fStack_5bc +
                      fStack_14c * fStack_54c + fStack_dc * fStack_1cc + fStack_10c,
                      fStack_460 * fStack_860 +
                      fStack_3f0 * fStack_7f0 +
                      fStack_380 * fStack_470 +
                      fStack_310 * fStack_710 +
                      fStack_2a0 * fStack_6a0 +
                      fStack_230 * fStack_320 +
                      fStack_1c0 * fStack_5c0 +
                      fStack_150 * fStack_550 + fStack_e0 * fStack_1d0 + fStack_110);
        local_948 = (float)uVar21;
        fStack_944 = (float)((ulong)uVar21 >> 0x20);
        fStack_940 = (float)uVar22;
        fStack_93c = (float)((ulong)uVar22 >> 0x20);
        local_9b8 = (float)uVar27;
        fStack_9b4 = (float)((ulong)uVar27 >> 0x20);
        fStack_9b0 = (float)uVar28;
        fStack_9ac = (float)((ulong)uVar28 >> 0x20);
        local_a98 = (float)uVar23;
        fStack_a94 = (float)((ulong)uVar23 >> 0x20);
        fStack_a90 = (float)uVar24;
        fStack_a8c = (float)((ulong)uVar24 >> 0x20);
        local_b08 = (float)uVar29;
        fStack_b04 = (float)((ulong)uVar29 >> 0x20);
        fStack_b00 = (float)uVar30;
        fStack_afc = (float)((ulong)uVar30 >> 0x20);
        local_be8 = (float)uVar25;
        fStack_be4 = (float)((ulong)uVar25 >> 0x20);
        fStack_be0 = (float)uVar26;
        fStack_bdc = (float)((ulong)uVar26 >> 0x20);
        local_c58 = (float)uVar31;
        fStack_c54 = (float)((ulong)uVar31 >> 0x20);
        fStack_c50 = (float)uVar32;
        fStack_c4c = (float)((ulong)uVar32 >> 0x20);
        uVar21 = local_2158[0xe];
        uVar22 = local_2158[0xf];
        uVar23 = local_2160[0xe];
        uVar24 = local_2160[0xf];
        uVar25 = local_2168[0xe];
        uVar26 = local_2168[0xf];
        uVar27 = local_2158[0x10];
        uVar28 = local_2158[0x11];
        uVar29 = local_2160[0x10];
        uVar30 = local_2160[0x11];
        uVar31 = local_2168[0x10];
        uVar32 = local_2168[0x11];
        local_2108[4] =
             CONCAT44(fStack_464 * fStack_c54 +
                      fStack_3f4 * fStack_be4 +
                      fStack_384 * fStack_864 +
                      fStack_314 * fStack_b04 +
                      fStack_2a4 * fStack_a94 +
                      fStack_234 * fStack_714 +
                      fStack_1c4 * fStack_9b4 +
                      fStack_154 * fStack_944 + fStack_e4 * fStack_5c4 + fStack_114,
                      local_468 * local_c58 +
                      local_3f8 * local_be8 +
                      local_388 * local_868 +
                      local_318 * local_b08 +
                      local_2a8 * local_a98 +
                      local_238 * local_718 +
                      local_1c8 * local_9b8 +
                      local_158 * local_948 + local_e8 * local_5c8 + local_118);
        local_2108[5] =
             CONCAT44(fStack_45c * fStack_c4c +
                      fStack_3ec * fStack_bdc +
                      fStack_37c * fStack_85c +
                      fStack_30c * fStack_afc +
                      fStack_29c * fStack_a8c +
                      fStack_22c * fStack_70c +
                      fStack_1bc * fStack_9ac +
                      fStack_14c * fStack_93c + fStack_dc * fStack_5bc + fStack_10c,
                      fStack_460 * fStack_c50 +
                      fStack_3f0 * fStack_be0 +
                      fStack_380 * fStack_860 +
                      fStack_310 * fStack_b00 +
                      fStack_2a0 * fStack_a90 +
                      fStack_230 * fStack_710 +
                      fStack_1c0 * fStack_9b0 +
                      fStack_150 * fStack_940 + fStack_e0 * fStack_5c0 + fStack_110);
        local_d38 = (float)uVar21;
        fStack_d34 = (float)((ulong)uVar21 >> 0x20);
        fStack_d30 = (float)uVar22;
        fStack_d2c = (float)((ulong)uVar22 >> 0x20);
        local_da8 = (float)uVar27;
        fStack_da4 = (float)((ulong)uVar27 >> 0x20);
        fStack_da0 = (float)uVar28;
        fStack_d9c = (float)((ulong)uVar28 >> 0x20);
        local_e88 = (float)uVar23;
        fStack_e84 = (float)((ulong)uVar23 >> 0x20);
        fStack_e80 = (float)uVar24;
        fStack_e7c = (float)((ulong)uVar24 >> 0x20);
        local_ef8 = (float)uVar29;
        fStack_ef4 = (float)((ulong)uVar29 >> 0x20);
        fStack_ef0 = (float)uVar30;
        fStack_eec = (float)((ulong)uVar30 >> 0x20);
        local_fd8 = (float)uVar25;
        fStack_fd4 = (float)((ulong)uVar25 >> 0x20);
        fStack_fd0 = (float)uVar26;
        fStack_fcc = (float)((ulong)uVar26 >> 0x20);
        local_1048 = (float)uVar31;
        fStack_1044 = (float)((ulong)uVar31 >> 0x20);
        fStack_1040 = (float)uVar32;
        fStack_103c = (float)((ulong)uVar32 >> 0x20);
        local_2108[6] =
             CONCAT44(fStack_464 * fStack_1044 +
                      fStack_3f4 * fStack_fd4 +
                      fStack_384 * fStack_c54 +
                      fStack_314 * fStack_ef4 +
                      fStack_2a4 * fStack_e84 +
                      fStack_234 * fStack_b04 +
                      fStack_1c4 * fStack_da4 +
                      fStack_154 * fStack_d34 + fStack_e4 * fStack_9b4 + fStack_114,
                      local_468 * local_1048 +
                      local_3f8 * local_fd8 +
                      local_388 * local_c58 +
                      local_318 * local_ef8 +
                      local_2a8 * local_e88 +
                      local_238 * local_b08 +
                      local_1c8 * local_da8 +
                      local_158 * local_d38 + local_e8 * local_9b8 + local_118);
        local_2108[7] =
             CONCAT44(fStack_45c * fStack_103c +
                      fStack_3ec * fStack_fcc +
                      fStack_37c * fStack_c4c +
                      fStack_30c * fStack_eec +
                      fStack_29c * fStack_e7c +
                      fStack_22c * fStack_afc +
                      fStack_1bc * fStack_d9c +
                      fStack_14c * fStack_d2c + fStack_dc * fStack_9ac + fStack_10c,
                      fStack_460 * fStack_1040 +
                      fStack_3f0 * fStack_fd0 +
                      fStack_380 * fStack_c50 +
                      fStack_310 * fStack_ef0 +
                      fStack_2a0 * fStack_e80 +
                      fStack_230 * fStack_b00 +
                      fStack_1c0 * fStack_da0 +
                      fStack_150 * fStack_d30 + fStack_e0 * fStack_9b0 + fStack_110);
        local_2158 = local_2158 + 0x10;
        local_2160 = local_2160 + 0x10;
        local_2168 = local_2168 + 0x10;
        local_2108 = local_2108 + 8;
        local_2200 = local_2200 + 4;
      }
      for (; local_2200 + 1 < iVar1; local_2200 = local_2200 + 2) {
        local_10b8 = (float)*local_2158;
        fStack_10b4 = (float)((ulong)*local_2158 >> 0x20);
        fStack_10b0 = (float)local_2158[1];
        fStack_10ac = (float)((ulong)local_2158[1] >> 0x20);
        local_1128 = (float)local_2158[2];
        fStack_1124 = (float)((ulong)local_2158[2] >> 0x20);
        fStack_1120 = (float)local_2158[3];
        fStack_111c = (float)((ulong)local_2158[3] >> 0x20);
        local_1198 = (float)local_2158[4];
        fStack_1194 = (float)((ulong)local_2158[4] >> 0x20);
        fStack_1190 = (float)local_2158[5];
        fStack_118c = (float)((ulong)local_2158[5] >> 0x20);
        local_1208 = (float)*local_2160;
        fStack_1204 = (float)((ulong)*local_2160 >> 0x20);
        fStack_1200 = (float)local_2160[1];
        fStack_11fc = (float)((ulong)local_2160[1] >> 0x20);
        local_1278 = (float)local_2160[2];
        fStack_1274 = (float)((ulong)local_2160[2] >> 0x20);
        fStack_1270 = (float)local_2160[3];
        fStack_126c = (float)((ulong)local_2160[3] >> 0x20);
        local_12e8 = (float)local_2160[4];
        fStack_12e4 = (float)((ulong)local_2160[4] >> 0x20);
        fStack_12e0 = (float)local_2160[5];
        fStack_12dc = (float)((ulong)local_2160[5] >> 0x20);
        local_1358 = (float)*local_2168;
        fStack_1354 = (float)((ulong)*local_2168 >> 0x20);
        fStack_1350 = (float)local_2168[1];
        fStack_134c = (float)((ulong)local_2168[1] >> 0x20);
        local_13c8 = (float)local_2168[2];
        fStack_13c4 = (float)((ulong)local_2168[2] >> 0x20);
        fStack_13c0 = (float)local_2168[3];
        fStack_13bc = (float)((ulong)local_2168[3] >> 0x20);
        local_1438 = (float)local_2168[4];
        fStack_1434 = (float)((ulong)local_2168[4] >> 0x20);
        fStack_1430 = (float)local_2168[5];
        fStack_142c = (float)((ulong)local_2168[5] >> 0x20);
        uVar21 = local_2158[6];
        uVar22 = local_2158[7];
        uVar23 = local_2160[6];
        uVar24 = local_2160[7];
        uVar25 = local_2168[6];
        uVar26 = local_2168[7];
        uVar27 = local_2158[8];
        uVar28 = local_2158[9];
        uVar29 = local_2160[8];
        uVar30 = local_2160[9];
        uVar31 = local_2168[8];
        uVar32 = local_2168[9];
        *local_2108 = CONCAT44(fStack_464 * fStack_1434 +
                               fStack_3f4 * fStack_13c4 +
                               fStack_384 * fStack_1354 +
                               fStack_314 * fStack_12e4 +
                               fStack_2a4 * fStack_1274 +
                               fStack_234 * fStack_1204 +
                               fStack_1c4 * fStack_1194 +
                               fStack_154 * fStack_1124 + fStack_e4 * fStack_10b4 + fStack_114,
                               local_468 * local_1438 +
                               local_3f8 * local_13c8 +
                               local_388 * local_1358 +
                               local_318 * local_12e8 +
                               local_2a8 * local_1278 +
                               local_238 * local_1208 +
                               local_1c8 * local_1198 +
                               local_158 * local_1128 + local_e8 * local_10b8 + local_118);
        local_2108[1] =
             CONCAT44(fStack_45c * fStack_142c +
                      fStack_3ec * fStack_13bc +
                      fStack_37c * fStack_134c +
                      fStack_30c * fStack_12dc +
                      fStack_29c * fStack_126c +
                      fStack_22c * fStack_11fc +
                      fStack_1bc * fStack_118c +
                      fStack_14c * fStack_111c + fStack_dc * fStack_10ac + fStack_10c,
                      fStack_460 * fStack_1430 +
                      fStack_3f0 * fStack_13c0 +
                      fStack_380 * fStack_1350 +
                      fStack_310 * fStack_12e0 +
                      fStack_2a0 * fStack_1270 +
                      fStack_230 * fStack_1200 +
                      fStack_1c0 * fStack_1190 +
                      fStack_150 * fStack_1120 + fStack_e0 * fStack_10b0 + fStack_110);
        local_1518 = (float)uVar21;
        fStack_1514 = (float)((ulong)uVar21 >> 0x20);
        fStack_1510 = (float)uVar22;
        fStack_150c = (float)((ulong)uVar22 >> 0x20);
        local_1588 = (float)uVar27;
        fStack_1584 = (float)((ulong)uVar27 >> 0x20);
        fStack_1580 = (float)uVar28;
        fStack_157c = (float)((ulong)uVar28 >> 0x20);
        local_1668 = (float)uVar23;
        fStack_1664 = (float)((ulong)uVar23 >> 0x20);
        fStack_1660 = (float)uVar24;
        fStack_165c = (float)((ulong)uVar24 >> 0x20);
        local_16d8 = (float)uVar29;
        fStack_16d4 = (float)((ulong)uVar29 >> 0x20);
        fStack_16d0 = (float)uVar30;
        fStack_16cc = (float)((ulong)uVar30 >> 0x20);
        local_17b8 = (float)uVar25;
        fStack_17b4 = (float)((ulong)uVar25 >> 0x20);
        fStack_17b0 = (float)uVar26;
        fStack_17ac = (float)((ulong)uVar26 >> 0x20);
        local_1828 = (float)uVar31;
        fStack_1824 = (float)((ulong)uVar31 >> 0x20);
        fStack_1820 = (float)uVar32;
        fStack_181c = (float)((ulong)uVar32 >> 0x20);
        local_2108[2] =
             CONCAT44(fStack_464 * fStack_1824 +
                      fStack_3f4 * fStack_17b4 +
                      fStack_384 * fStack_1434 +
                      fStack_314 * fStack_16d4 +
                      fStack_2a4 * fStack_1664 +
                      fStack_234 * fStack_12e4 +
                      fStack_1c4 * fStack_1584 +
                      fStack_154 * fStack_1514 + fStack_e4 * fStack_1194 + fStack_114,
                      local_468 * local_1828 +
                      local_3f8 * local_17b8 +
                      local_388 * local_1438 +
                      local_318 * local_16d8 +
                      local_2a8 * local_1668 +
                      local_238 * local_12e8 +
                      local_1c8 * local_1588 +
                      local_158 * local_1518 + local_e8 * local_1198 + local_118);
        local_2108[3] =
             CONCAT44(fStack_45c * fStack_181c +
                      fStack_3ec * fStack_17ac +
                      fStack_37c * fStack_142c +
                      fStack_30c * fStack_16cc +
                      fStack_29c * fStack_165c +
                      fStack_22c * fStack_12dc +
                      fStack_1bc * fStack_157c +
                      fStack_14c * fStack_150c + fStack_dc * fStack_118c + fStack_10c,
                      fStack_460 * fStack_1820 +
                      fStack_3f0 * fStack_17b0 +
                      fStack_380 * fStack_1430 +
                      fStack_310 * fStack_16d0 +
                      fStack_2a0 * fStack_1660 +
                      fStack_230 * fStack_12e0 +
                      fStack_1c0 * fStack_1580 +
                      fStack_150 * fStack_1510 + fStack_e0 * fStack_1190 + fStack_110);
        local_2158 = local_2158 + 8;
        local_2160 = local_2160 + 8;
        local_2168 = local_2168 + 8;
        local_2108 = local_2108 + 4;
      }
      for (; local_2200 < iVar1; local_2200 = local_2200 + 1) {
        local_1898 = (float)*local_2158;
        fStack_1894 = (float)((ulong)*local_2158 >> 0x20);
        fStack_1890 = (float)local_2158[1];
        fStack_188c = (float)((ulong)local_2158[1] >> 0x20);
        local_1908 = (float)local_2158[2];
        fStack_1904 = (float)((ulong)local_2158[2] >> 0x20);
        fStack_1900 = (float)local_2158[3];
        fStack_18fc = (float)((ulong)local_2158[3] >> 0x20);
        local_1978 = (float)local_2158[4];
        fStack_1974 = (float)((ulong)local_2158[4] >> 0x20);
        fStack_1970 = (float)local_2158[5];
        fStack_196c = (float)((ulong)local_2158[5] >> 0x20);
        local_19e8 = (float)*local_2160;
        fStack_19e4 = (float)((ulong)*local_2160 >> 0x20);
        fStack_19e0 = (float)local_2160[1];
        fStack_19dc = (float)((ulong)local_2160[1] >> 0x20);
        local_1a58 = (float)local_2160[2];
        fStack_1a54 = (float)((ulong)local_2160[2] >> 0x20);
        fStack_1a50 = (float)local_2160[3];
        fStack_1a4c = (float)((ulong)local_2160[3] >> 0x20);
        local_1ac8 = (float)local_2160[4];
        fStack_1ac4 = (float)((ulong)local_2160[4] >> 0x20);
        fStack_1ac0 = (float)local_2160[5];
        fStack_1abc = (float)((ulong)local_2160[5] >> 0x20);
        local_1b38 = (float)*local_2168;
        fStack_1b34 = (float)((ulong)*local_2168 >> 0x20);
        fStack_1b30 = (float)local_2168[1];
        fStack_1b2c = (float)((ulong)local_2168[1] >> 0x20);
        local_1ba8 = (float)local_2168[2];
        fStack_1ba4 = (float)((ulong)local_2168[2] >> 0x20);
        fStack_1ba0 = (float)local_2168[3];
        fStack_1b9c = (float)((ulong)local_2168[3] >> 0x20);
        local_1c18 = (float)local_2168[4];
        fStack_1c14 = (float)((ulong)local_2168[4] >> 0x20);
        fStack_1c10 = (float)local_2168[5];
        fStack_1c0c = (float)((ulong)local_2168[5] >> 0x20);
        *local_2108 = CONCAT44(fStack_464 * fStack_1c14 +
                               fStack_3f4 * fStack_1ba4 +
                               fStack_384 * fStack_1b34 +
                               fStack_314 * fStack_1ac4 +
                               fStack_2a4 * fStack_1a54 +
                               fStack_234 * fStack_19e4 +
                               fStack_1c4 * fStack_1974 +
                               fStack_154 * fStack_1904 + fStack_e4 * fStack_1894 + fStack_114,
                               local_468 * local_1c18 +
                               local_3f8 * local_1ba8 +
                               local_388 * local_1b38 +
                               local_318 * local_1ac8 +
                               local_2a8 * local_1a58 +
                               local_238 * local_19e8 +
                               local_1c8 * local_1978 +
                               local_158 * local_1908 + local_e8 * local_1898 + local_118);
        local_2108[1] =
             CONCAT44(fStack_45c * fStack_1c0c +
                      fStack_3ec * fStack_1b9c +
                      fStack_37c * fStack_1b2c +
                      fStack_30c * fStack_1abc +
                      fStack_29c * fStack_1a4c +
                      fStack_22c * fStack_19dc +
                      fStack_1bc * fStack_196c +
                      fStack_14c * fStack_18fc + fStack_dc * fStack_188c + fStack_10c,
                      fStack_460 * fStack_1c10 +
                      fStack_3f0 * fStack_1ba0 +
                      fStack_380 * fStack_1b30 +
                      fStack_310 * fStack_1ac0 +
                      fStack_2a0 * fStack_1a50 +
                      fStack_230 * fStack_19e0 +
                      fStack_1c0 * fStack_1970 +
                      fStack_150 * fStack_1900 + fStack_e0 * fStack_1890 + fStack_110);
        local_2158 = local_2158 + 4;
        local_2160 = local_2160 + 4;
        local_2168 = local_2168 + 4;
        local_2108 = local_2108 + 2;
      }
      local_2158 = (undefined8 *)((long)local_2158 + (long)iVar35 * 4);
      local_2160 = (undefined8 *)((long)local_2160 + (long)iVar35 * 4);
      local_2168 = (undefined8 *)((long)local_2168 + (long)iVar35 * 4);
    }
  }
  return;
}

Assistant:

static void convdw3x3s2_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const int tailstep = (w - 2 * outw + w) * 4;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_load_ps(k0);
        __m128 _k01 = _mm_load_ps(k0 + 4);
        __m128 _k02 = _mm_load_ps(k0 + 8);
        __m128 _k10 = _mm_load_ps(k0 + 12);
        __m128 _k11 = _mm_load_ps(k0 + 16);
        __m128 _k12 = _mm_load_ps(k0 + 20);
        __m128 _k20 = _mm_load_ps(k0 + 24);
        __m128 _k21 = _mm_load_ps(k0 + 28);
        __m128 _k22 = _mm_load_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                __m128 _r06 = _mm_load_ps(r0 + 24);
                __m128 _r16 = _mm_load_ps(r1 + 24);
                __m128 _r26 = _mm_load_ps(r2 + 24);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r05, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r06, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r15, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r16, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r24, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r25, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r26, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r07 = _mm_load_ps(r0 + 28);
                __m128 _r17 = _mm_load_ps(r1 + 28);
                __m128 _r27 = _mm_load_ps(r2 + 28);
                __m128 _r08 = _mm_load_ps(r0 + 32);
                __m128 _r18 = _mm_load_ps(r1 + 32);
                __m128 _r28 = _mm_load_ps(r2 + 32);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r06, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r07, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r08, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r16, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r17, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r18, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r26, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r27, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r28, _sum3);

                _mm_store_ps(outptr0 + 12, _sum3);

                r0 += 2 * 16;
                r1 += 2 * 16;
                r2 += 2 * 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r04, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r14, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r23, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r24, _sum1);

                _mm_store_ps(outptr0 + 4, _sum1);

                r0 += 2 * 8;
                r1 += 2 * 8;
                r2 += 2 * 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);
                _mm_store_ps(outptr0, _sum0);
                r0 += 2 * 4;
                r1 += 2 * 4;
                r2 += 2 * 4;
                outptr0 += 4;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}